

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_copy(int param_1,Fl_Text_Editor *e)

{
  int iVar1;
  Fl_Text_Buffer *pFVar2;
  EVP_PKEY_CTX *dst;
  size_t sVar3;
  char *copy;
  Fl_Text_Editor *e_local;
  int param_0_local;
  
  pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  iVar1 = Fl_Text_Buffer::selected(pFVar2);
  if (iVar1 != 0) {
    pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
    dst = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(pFVar2);
    if (*dst != (EVP_PKEY_CTX)0x0) {
      sVar3 = strlen((char *)dst);
      Fl::copy(dst,(EVP_PKEY_CTX *)(sVar3 & 0xffffffff));
    }
    free(dst);
    Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_copy(int, Fl_Text_Editor* e) {
  if (!e->buffer()->selected()) return 1;
  const char *copy = e->buffer()->selection_text();
  if (*copy) Fl::copy(copy, (int) strlen(copy), 1);
  free((void*)copy);
  e->show_insert_position();
  return 1;
}